

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qintc.cc
# Opt level: O2

int main(void)

{
  char cVar1;
  uchar uVar2;
  int iVar3;
  ostream *poVar4;
  unsigned_long *in_RCX;
  longlong *b;
  unsigned_long_long *b_00;
  char c2;
  char c1;
  unsigned_long_long local_78;
  int local_6c;
  int32_t i1;
  char max_sc;
  uint32_t u1;
  int32_t i2;
  longlong min_ll;
  uint64_t ul2;
  unsigned_long_long max_ull;
  longlong max_ll;
  uint64_t ul1;
  
  u1 = 0xbb40e64d;
  i1 = -0x44bf19b3;
  ul1 = 0x10000000000;
  ul2 = 0x3039;
  i2 = 0x51;
  c1 = -9;
  c2 = 'W';
  poVar4 = std::operator<<((ostream *)&std::cout,"QIntC::to_int<int32_t>(i1)");
  poVar4 = std::operator<<(poVar4,": ");
  poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,i1);
  poVar4 = std::operator<<(poVar4," ");
  std::ostream::operator<<((ostream *)poVar4,-0x44bf19b3);
  poVar4 = std::operator<<((ostream *)&std::cout," PASSED");
  std::endl<char,std::char_traits<char>>(poVar4);
  poVar4 = std::operator<<((ostream *)&std::cout,"QIntC::to_uint<uint32_t>(u1)");
  poVar4 = std::operator<<(poVar4,": ");
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  poVar4 = std::operator<<(poVar4," ");
  std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  poVar4 = std::operator<<((ostream *)&std::cout," PASSED");
  std::endl<char,std::char_traits<char>>(poVar4);
  iVar3 = QIntC::IntConverter<unsigned_int,_int,_false,_true>::convert(&u1);
  poVar4 = std::operator<<((ostream *)&std::cout,"QIntC::to_int<uint32_t>(u1)");
  poVar4 = std::operator<<(poVar4,": ");
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  poVar4 = std::operator<<(poVar4," ");
  std::ostream::operator<<((ostream *)poVar4,iVar3);
  poVar4 = std::operator<<((ostream *)&std::cout," FAILED");
  std::endl<char,std::char_traits<char>>(poVar4);
  QIntC::IntConverter<int,_unsigned_int,_true,_false>::convert(&i1);
  poVar4 = std::operator<<((ostream *)&std::cout,"QIntC::to_uint<int32_t>(i1)");
  poVar4 = std::operator<<(poVar4,": ");
  poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,i1);
  poVar4 = std::operator<<(poVar4," ");
  std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  poVar4 = std::operator<<((ostream *)&std::cout," FAILED");
  std::endl<char,std::char_traits<char>>(poVar4);
  try_convert_real<unsigned_long,int>
            ("QIntC::to_int<uint64_t>(ul1)",false,(_func_int_unsigned_long_ptr *)&ul1,in_RCX);
  try_convert_real<unsigned_long,int>
            ("QIntC::to_int<uint64_t>(ul2)",true,(_func_int_unsigned_long_ptr *)&ul2,in_RCX);
  QIntC::IntConverter<unsigned_long,_unsigned_int,_false,_false>::convert(&ul2);
  poVar4 = std::operator<<((ostream *)&std::cout,"QIntC::to_uint<uint64_t>(ul2)");
  poVar4 = std::operator<<(poVar4,": ");
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  poVar4 = std::operator<<(poVar4," ");
  std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  poVar4 = std::operator<<((ostream *)&std::cout," PASSED");
  std::endl<char,std::char_traits<char>>(poVar4);
  poVar4 = std::operator<<((ostream *)&std::cout,"QIntC::to_offset<uint32_t>(u1)");
  poVar4 = std::operator<<(poVar4,": ");
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  poVar4 = std::operator<<(poVar4," ");
  std::ostream::_M_insert<long_long>((longlong)poVar4);
  poVar4 = std::operator<<((ostream *)&std::cout," PASSED");
  std::endl<char,std::char_traits<char>>(poVar4);
  poVar4 = std::operator<<((ostream *)&std::cout,"QIntC::to_offset<int32_t>(i1)");
  poVar4 = std::operator<<(poVar4,": ");
  poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,i1);
  poVar4 = std::operator<<(poVar4," ");
  std::ostream::_M_insert<long_long>((longlong)poVar4);
  poVar4 = std::operator<<((ostream *)&std::cout," PASSED");
  std::endl<char,std::char_traits<char>>(poVar4);
  QIntC::IntConverter<int,_unsigned_long_long,_true,_false>::convert(&i1);
  poVar4 = std::operator<<((ostream *)&std::cout,"QIntC::to_ulonglong<int32_t>(i1)");
  poVar4 = std::operator<<(poVar4,": ");
  poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,i1);
  poVar4 = std::operator<<(poVar4," ");
  std::ostream::_M_insert<unsigned_long_long>((ulonglong)poVar4);
  poVar4 = std::operator<<((ostream *)&std::cout," FAILED");
  std::endl<char,std::char_traits<char>>(poVar4);
  cVar1 = QIntC::IntConverter<int,_char,_true,_true>::convert(&i2);
  poVar4 = std::operator<<((ostream *)&std::cout,"QIntC::to_char<int32_t>(i2)");
  poVar4 = std::operator<<(poVar4,": ");
  poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,i2);
  poVar4 = std::operator<<(poVar4," ");
  std::operator<<(poVar4,cVar1);
  poVar4 = std::operator<<((ostream *)&std::cout," PASSED");
  std::endl<char,std::char_traits<char>>(poVar4);
  uVar2 = QIntC::IntConverter<int,_unsigned_char,_true,_false>::convert(&i2);
  poVar4 = std::operator<<((ostream *)&std::cout,"QIntC::to_uchar<int32_t>(i2)");
  poVar4 = std::operator<<(poVar4,": ");
  poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,i2);
  poVar4 = std::operator<<(poVar4," ");
  std::operator<<(poVar4,uVar2);
  poVar4 = std::operator<<((ostream *)&std::cout," PASSED");
  std::endl<char,std::char_traits<char>>(poVar4);
  uVar2 = QIntC::IntConverter<signed_char,_unsigned_char,_true,_false>::convert(&c1);
  poVar4 = std::operator<<((ostream *)&std::cout,"QIntC::to_uchar<signed char>(c1)");
  poVar4 = std::operator<<(poVar4,": ");
  poVar4 = std::operator<<(poVar4,c1);
  poVar4 = std::operator<<(poVar4," ");
  std::operator<<(poVar4,uVar2);
  poVar4 = std::operator<<((ostream *)&std::cout," FAILED");
  std::endl<char,std::char_traits<char>>(poVar4);
  uVar2 = QIntC::IntConverter<char,_unsigned_char,_true,_false>::convert(&c2);
  poVar4 = std::operator<<((ostream *)&std::cout,"QIntC::to_uchar<char>(c2)");
  poVar4 = std::operator<<(poVar4,": ");
  poVar4 = std::operator<<(poVar4,c2);
  poVar4 = std::operator<<(poVar4," ");
  std::operator<<(poVar4,uVar2);
  poVar4 = std::operator<<((ostream *)&std::cout," PASSED");
  std::endl<char,std::char_traits<char>>(poVar4);
  cVar1 = c2;
  poVar4 = std::operator<<((ostream *)&std::cout,"QIntC::to_char<char>(c2)");
  poVar4 = std::operator<<(poVar4,": ");
  poVar4 = std::operator<<(poVar4,c2);
  poVar4 = std::operator<<(poVar4," ");
  std::operator<<(poVar4,cVar1);
  poVar4 = std::operator<<((ostream *)&std::cout," PASSED");
  std::endl<char,std::char_traits<char>>(poVar4);
  max_ull = 0xffffffffffffffff;
  max_ll = 0x7fffffffffffffff;
  b = &min_ll;
  min_ll = -0x8000000000000000;
  max_sc = '\x7f';
  local_78._0_4_ = 1;
  local_6c = 2;
  try_range_check_real<int>("1 + 2",SUB81(&local_78,0),&local_6c,(int *)b);
  local_78._0_4_ = 0xffffffff;
  local_6c = 2;
  try_range_check_real<int>("-1 + 2",SUB81(&local_78,0),&local_6c,(int *)b);
  local_78 = CONCAT44(local_78._4_4_,0xffffff9c);
  local_6c = -200;
  try_range_check_real<int>("-100 + -200",SUB81(&local_78,0),&local_6c,(int *)b);
  local_78 = 0;
  try_range_check_real<long_long>("max_ll + 0LL",true,&max_ll,(longlong *)&local_78);
  local_78 = 1;
  try_range_check_real<long_long>("max_ll + 1LL",false,&max_ll,(longlong *)&local_78);
  local_78 = 0;
  try_range_check_real<long_long>("max_ll + 0LL",true,&max_ll,(longlong *)&local_78);
  local_78 = 1;
  try_range_check_real<long_long>("max_ll + 1LL",false,&max_ll,(longlong *)&local_78);
  local_78 = 0;
  try_range_check_real<unsigned_long_long>("max_ull + 0ULL",true,&max_ull,&local_78);
  local_78 = 1;
  try_range_check_real<unsigned_long_long>("max_ull + 1ULL",false,&max_ull,&local_78);
  local_78 = 0;
  try_range_check_real<long_long>("min_ll + 0LL",true,&min_ll,(longlong *)&local_78);
  local_78 = 0xffffffffffffffff;
  b_00 = &local_78;
  try_range_check_real<long_long>("min_ll + -1LL",false,&min_ll,(longlong *)b_00);
  QIntC::range_check<signed_char>(&max_sc,&max_sc);
  poVar4 = std::operator<<((ostream *)&std::cout,"max_sc + max_sc");
  std::operator<<(poVar4,": okay");
  poVar4 = std::operator<<((ostream *)&std::cout," FAILED");
  std::endl<char,std::char_traits<char>>(poVar4);
  local_78 = CONCAT71(local_78._1_7_,0x21);
  local_6c = CONCAT31(local_6c._1_3_,0x23);
  QIntC::range_check<char>((char *)&local_78,(char *)&local_6c);
  poVar4 = std::operator<<((ostream *)&std::cout,"\'!\' + \'#\'");
  std::operator<<(poVar4,": okay");
  poVar4 = std::operator<<((ostream *)&std::cout," PASSED");
  std::endl<char,std::char_traits<char>>(poVar4);
  local_78._0_4_ = 1;
  local_6c = 2;
  try_range_check_subtract_real<int>("1 - 2",SUB81(&local_78,0),&local_6c,(int *)b_00);
  local_78._0_4_ = 0xffffffff;
  local_6c = -2;
  try_range_check_subtract_real<int>("-1 - -2",SUB81(&local_78,0),&local_6c,(int *)b_00);
  local_78._0_4_ = 1;
  local_6c = 10;
  try_range_check_subtract_real<int>("1 - 10",SUB81(&local_78,0),&local_6c,(int *)b_00);
  local_78 = CONCAT44(local_78._4_4_,0xffffffff);
  local_6c = -10;
  try_range_check_subtract_real<int>("-1 - -10",SUB81(&local_78,0),&local_6c,(int *)b_00);
  local_78 = 0;
  try_range_check_subtract_real<long_long>("0LL - min_ll",false,(longlong *)&local_78,&min_ll);
  local_78 = 1;
  try_range_check_subtract_real<long_long>("1LL - min_ll",false,(longlong *)&local_78,&min_ll);
  local_78 = 0;
  try_range_check_subtract_real<long_long>("0LL - max_ll",true,(longlong *)&local_78,&max_ll);
  local_78 = 0xffffffffffffffff;
  try_range_check_subtract_real<long_long>("-1LL - max_ll",true,(longlong *)&local_78,&max_ll);
  local_78 = 0xfffffffffffffffe;
  try_range_check_subtract_real<long_long>("-2LL - max_ll",false,(longlong *)&local_78,&max_ll);
  return 0;
}

Assistant:

int
main()
{
    uint32_t u1 = 3141592653U;                  // Too big for signed type
    int32_t i1 = -1153374643;                   // Same bit pattern as u1
    uint64_t ul1 = 1099511627776LL;             // Too big for 32-bit
    uint64_t ul2 = 12345;                       // Fits into 32-bit
    int32_t i2 = 81;                            // Fits in char and uchar
    auto c1 = static_cast<signed char>('\xf7'); // Signed value when char
    char c2 = 'W';                              // char; may be signed or unsigned

    // Verify i1 and u1 have same bit pattern
    assert(static_cast<uint32_t>(i1) == u1);
    // Verify that we can unsafely convert between signed and unsigned char
    assert(c1 == static_cast<signed char>(static_cast<unsigned char>(c1)));

    try_convert(true, QIntC::to_int<int32_t>, i1);
    try_convert(true, QIntC::to_uint<uint32_t>, u1);
    try_convert(false, QIntC::to_int<uint32_t>, u1);
    try_convert(false, QIntC::to_uint<int32_t>, i1);
    try_convert(false, QIntC::to_int<uint64_t>, ul1);
    try_convert(true, QIntC::to_int<uint64_t>, ul2);
    try_convert(true, QIntC::to_uint<uint64_t>, ul2);
    try_convert(true, QIntC::to_offset<uint32_t>, u1);
    try_convert(true, QIntC::to_offset<int32_t>, i1);
    try_convert(false, QIntC::to_ulonglong<int32_t>, i1);
    try_convert(true, QIntC::to_char<int32_t>, i2);
    try_convert(true, QIntC::to_uchar<int32_t>, i2);
    try_convert(false, QIntC::to_uchar<signed char>, c1);
    try_convert(true, QIntC::to_uchar<char>, c2);
    try_convert(true, QIntC::to_char<char>, c2);

    auto constexpr max_ll = std::numeric_limits<long long>::max();
    auto constexpr max_ull = std::numeric_limits<unsigned long long>::max();
    auto constexpr min_ll = std::numeric_limits<long long>::min();
    auto constexpr max_sc = std::numeric_limits<signed char>::max();
    try_range_check(true, 1, 2);
    try_range_check(true, -1, 2);
    try_range_check(true, -100, -200);
    try_range_check(true, max_ll, 0LL);
    try_range_check(false, max_ll, 1LL);
    try_range_check(true, max_ll, 0LL);
    try_range_check(false, max_ll, 1LL);
    try_range_check(true, max_ull, 0ULL);
    try_range_check(false, max_ull, 1ULL);
    try_range_check(true, min_ll, 0LL);
    try_range_check(false, min_ll, -1LL);
    try_range_check(false, max_sc, max_sc);
    try_range_check(true, '!', '#');
    try_range_check_subtract(true, 1, 2);
    try_range_check_subtract(true, -1, -2);
    try_range_check_subtract(true, 1, 10);
    try_range_check_subtract(true, -1, -10);
    try_range_check_subtract(false, 0LL, min_ll);
    try_range_check_subtract(false, 1LL, min_ll);
    try_range_check_subtract(true, 0LL, max_ll);
    try_range_check_subtract(true, -1LL, max_ll);
    try_range_check_subtract(false, -2LL, max_ll);
    return 0;
}